

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

void anon_unknown.dwarf_fc7e::ReportAt
               (ParseContext *ctx,Lexeme *begin,Lexeme *end,char *pos,char *msg,__va_list_tag *args)

{
  Lexeme *pLVar1;
  bool bVar2;
  ErrorInfo **ppEVar3;
  size_t sVar4;
  ErrorInfo *this;
  ErrorInfo *local_50;
  char *local_48;
  char *messageEnd;
  char *messageStart;
  __va_list_tag *args_local;
  char *msg_local;
  char *pos_local;
  Lexeme *end_local;
  Lexeme *begin_local;
  ParseContext *ctx_local;
  
  messageStart = (char *)args;
  args_local = (__va_list_tag *)msg;
  msg_local = pos;
  pos_local = (char *)end;
  end_local = begin;
  begin_local = (Lexeme *)ctx;
  if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = ctx->errorBuf;
    }
    bVar2 = SmallArray<ErrorInfo_*,_4U>::empty(&ctx->errorInfo);
    if ((!bVar2) &&
       (ppEVar3 = SmallArray<ErrorInfo_*,_4U>::back
                            ((SmallArray<ErrorInfo_*,_4U> *)&begin_local[0x59].length),
       (*ppEVar3)->pos == msg_local)) {
      return;
    }
    messageEnd = begin_local[0x59].pos;
    vsnprintf(begin_local[0x59].pos,
              (ulong)(begin_local[0x59].type -
                     ((int)begin_local[0x59].pos - (int)*(undefined8 *)&begin_local[0x58].column)),
              (char *)args_local,messageStart);
    *(undefined1 *)
     (*(long *)&begin_local[0x58].column + (ulong)(begin_local[0x59].type - lex_number)) = 0;
    sVar4 = strlen(begin_local[0x59].pos);
    begin_local[0x59].pos = begin_local[0x59].pos + sVar4;
    local_48 = begin_local[0x59].pos;
    pLVar1 = begin_local + 0x59;
    this = ParseContext::get<ErrorInfo>((ParseContext *)begin_local);
    ErrorInfo::ErrorInfo
              (this,*(Allocator **)&begin_local[0xb1].column,messageEnd,local_48,end_local,
               (Lexeme *)pos_local,msg_local);
    local_50 = this;
    SmallArray<ErrorInfo_*,_4U>::push_back((SmallArray<ErrorInfo_*,_4U> *)&pLVar1->length,&local_50)
    ;
    AddErrorLocationInfo
              (*(char **)begin_local,msg_local,begin_local[0x59].pos,
               begin_local[0x59].type -
               ((int)begin_local[0x59].pos - (int)*(undefined8 *)&begin_local[0x58].column));
    sVar4 = strlen(begin_local[0x59].pos);
    begin_local[0x59].pos = begin_local[0x59].pos + sVar4;
  }
  begin_local[0x58].length = begin_local[0x58].length + 1;
  if (begin_local[0x58].length != 100) {
    return;
  }
  NULLC::SafeSprintf(begin_local[0x59].pos,
                     (ulong)(begin_local[0x59].type -
                            ((int)begin_local[0x59].pos -
                            (int)*(undefined8 *)&begin_local[0x58].column)),
                     "ERROR: error limit reached");
  sVar4 = strlen(begin_local[0x59].pos);
  begin_local[0x59].pos = begin_local[0x59].pos + sVar4;
  if ((begin_local[0x51].column & 1) != 0) {
    longjmp((__jmp_buf_tag *)(begin_local + 0x52),1);
  }
  __assert_fail("ctx.errorHandlerActive",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x37,
                "void (anonymous namespace)::ReportAt(ParseContext &, Lexeme *, Lexeme *, const char *, const char *, __va_list_tag *)"
               );
}

Assistant:

void ReportAt(ParseContext &ctx, Lexeme *begin, Lexeme *end, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			// Don't report multiple errors at the same position
			if(!ctx.errorInfo.empty() && ctx.errorInfo.back()->pos == pos)
				return;

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, begin, end, pos));

			AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}